

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

EAMParameters * __thiscall OpenMD::EAMAdapter::getEAMParam(EAMAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  EAMParameters *this_01;
  EAMParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> eamData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff18;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  errorStruct *peVar3;
  AtomType *in_stack_ffffffffffffff38;
  string local_a0 [64];
  undefined1 local_60 [96];
  
  bVar1 = isEAM((EAMAdapter *)0x299d96);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getEAMParam was passed an atomType (%s)\n\tthat does not appear to be an EAM atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getEAMParam could not find EAM\n\tparameters for atomType %s.\n",uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff38);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getEAMParam could not convert\n\tGenericData to EAMData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar3->severity = 1;
    peVar3->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x299f91);
  this_01 = SimpleTypeData<OpenMD::EAMParameters>::getData(this_00);
  EAMParameters::EAMParameters(this_01,(EAMParameters *)in_stack_ffffffffffffff18);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x299fbb);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x299fc8);
  return in_RDI;
}

Assistant:

EAMParameters EAMAdapter::getEAMParam() {
    if (!isEAM()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getEAMParam was passed an atomType (%s)\n"
               "\tthat does not appear to be an EAM atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(EAMtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getEAMParam could not find EAM\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<EAMData> eamData = std::dynamic_pointer_cast<EAMData>(data);
    if (eamData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getEAMParam could not convert\n"
               "\tGenericData to EAMData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return eamData->getData();
  }